

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O0

ListenerNode * __thiscall Selector::findListener(Selector *this,int fd,SelectorListener *listener)

{
  bool bVar1;
  ListenerNode **ppLVar2;
  int local_60;
  undefined1 local_50 [16];
  iterator i;
  ListenerNode n;
  SelectorListener *listener_local;
  int fd_local;
  Selector *this_local;
  
  ListenerNode::ListenerNode((ListenerNode *)&i,fd,listener);
  JetHead::list<Selector::ListenerNode_*>::begin((list<Selector::ListenerNode_*> *)(local_50 + 8));
  do {
    JetHead::list<Selector::ListenerNode_*>::end((list<Selector::ListenerNode_*> *)local_50);
    bVar1 = JetHead::list<Selector::ListenerNode_*>::iterator::operator!=
                      ((iterator *)(local_50 + 8),(iterator *)local_50);
    JetHead::list<Selector::ListenerNode_*>::iterator::~iterator((iterator *)local_50);
    if (!bVar1) {
      local_60 = 2;
LAB_0012e6b0:
      JetHead::list<Selector::ListenerNode_*>::iterator::~iterator((iterator *)(local_50 + 8));
      if (local_60 != 1) {
        this_local = (Selector *)0x0;
      }
      return (ListenerNode *)this_local;
    }
    ppLVar2 = JetHead::list<Selector::ListenerNode_*>::iterator::operator*
                        ((iterator *)(local_50 + 8));
    bVar1 = ListenerNode::operator==(*ppLVar2,(ListenerNode *)&i);
    if (bVar1) {
      ppLVar2 = JetHead::list<Selector::ListenerNode_*>::iterator::operator*
                          ((iterator *)(local_50 + 8));
      this_local = (Selector *)*ppLVar2;
      local_60 = 1;
      goto LAB_0012e6b0;
    }
    JetHead::list<Selector::ListenerNode_*>::iterator::operator++((iterator *)(local_50 + 8));
  } while( true );
}

Assistant:

Selector::ListenerNode *Selector::findListener( int fd, SelectorListener *listener )
{
	ListenerNode n( fd, listener );
	for (JetHead::list<ListenerNode*>::iterator i = mList.begin(); 
		 i != mList.end(); ++i)
	{
		if (*(*i) == n)
		{
			return *i;
		}
	}
		
	return NULL;
}